

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_wrapper_test.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  ostream *poVar2;
  Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string w;
  string v;
  string buf2;
  string buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string u;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string s;
  string buf3;
  
  this = (Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)operator_new(0x80);
  FlatFile<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  FlatFile((FlatFile<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)this,0,key_type_numeric_signed,4,10,0x1e);
  printf("Insert %d [%s]\n",3,"hello!");
  std::__cxx11::string::string((string *)&s,"hello!",(allocator *)&buf);
  std::__cxx11::string::string((string *)&local_90,(string *)&s);
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::insert(this,3,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::get(&buf,this,3);
  poVar2 = std::operator<<((ostream *)&std::cout,"Retrieve key 3 and got back ");
  poVar2 = std::operator<<(poVar2,(string *)&buf);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Updating value of key 3 to hi!");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string((string *)&t,"hi!",(allocator *)&buf2);
  std::__cxx11::string::string((string *)&local_d0,(string *)&t);
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::update(this,3,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::get(&buf2,this,3);
  poVar2 = std::operator<<((ostream *)&std::cout,"Retrieve key 3 after update and got back ");
  poVar2 = std::operator<<(poVar2,(string *)&buf2);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Delete key 3");
  std::endl<char,std::char_traits<char>>(poVar2);
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::deleteRecord(this,3);
  poVar2 = std::operator<<((ostream *)&std::cout,"Try and retrieve key 3 after deletion");
  std::endl<char,std::char_traits<char>>(poVar2);
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::get(&buf3,this,3);
  poVar2 = std::operator<<((ostream *)&std::cout,"Retrieve key 3 and got back status ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)(this->last_status).error);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  printf("Insert %d [%s]\n",3,"test1!");
  std::__cxx11::string::string((string *)&u,"test1!",(allocator *)&v);
  std::__cxx11::string::string((string *)&local_110,(string *)&u);
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::insert(this,3,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  printf("Insert %d [%s]\n",3,"test2!");
  std::__cxx11::string::string((string *)&v,"test2!",(allocator *)&w);
  std::__cxx11::string::string((string *)&local_130,(string *)&v);
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::insert(this,3,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  printf("Insert %d [%s]\n",4,"test3!");
  std::__cxx11::string::string((string *)&w,"test3!",(allocator *)&local_1f0);
  std::__cxx11::string::string((string *)&local_150,(string *)&w);
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::insert(this,4,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing equality query on key 3: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  pCVar3 = Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::equality(this,3);
  while( true ) {
    bVar1 = Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::next(pCVar3);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"[eq] Got back [");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(pCVar3->record).key);
    poVar2 = std::operator<<(poVar2,", ");
    Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getValue(&local_1f0,pCVar3);
    poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
    poVar2 = std::operator<<(poVar2,"]");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Cursor(pCVar3);
  operator_delete(pCVar3);
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing all records query: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  pCVar3 = Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::allRecords(this);
  while( true ) {
    bVar1 = Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::next(pCVar3);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"[all] Got back [");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(pCVar3->record).key);
    poVar2 = std::operator<<(poVar2,", ");
    Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getValue(&local_1f0,pCVar3);
    poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
    poVar2 = std::operator<<(poVar2,"]");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Cursor(pCVar3);
  operator_delete(pCVar3);
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing range query: 2<=key<=3 ");
  std::endl<char,std::char_traits<char>>(poVar2);
  pCVar3 = Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::range(this,2,3);
  while( true ) {
    bVar1 = Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::next(pCVar3);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"[range] Got back [");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(pCVar3->record).key);
    poVar2 = std::operator<<(poVar2,", ");
    Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getValue(&local_1f0,pCVar3);
    poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
    poVar2 = std::operator<<(poVar2,"]");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Cursor(pCVar3);
  operator_delete(pCVar3);
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Dictionary(this);
  operator_delete(this);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::~string((string *)&v);
  std::__cxx11::string::~string((string *)&u);
  std::__cxx11::string::~string((string *)&buf3);
  std::__cxx11::string::~string((string *)&buf2);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::~string((string *)&buf);
  std::__cxx11::string::~string((string *)&s);
  return 0;
}

Assistant:

int
main(
) {
	/* The following is example test code using int keys and string values */
	Dictionary<int, string> *dict = new FlatFile<int, string>(0, key_type_numeric_signed, sizeof(int), 10, 30);

	printf("Insert %d [%s]\n", 3, "hello!");

	string s = "hello!";

	dict->insert(3, s);

	string buf = dict->get(3);

	cout << "Retrieve key 3 and got back " << buf << endl << endl;

	cout << "Updating value of key 3 to hi!" << endl;

	string t = "hi!";

	dict->update(3, t);

	string buf2 = dict->get(3);

	cout << "Retrieve key 3 after update and got back " << buf2 << endl << endl;

	cout << "Delete key 3" << endl;
	dict->deleteRecord(3);

	cout << "Try and retrieve key 3 after deletion" << endl;

	string buf3 = dict->get(3);

	cout << "Retrieve key 3 and got back status " << (int) dict->last_status.error << endl << endl;

	printf("Insert %d [%s]\n", 3, "test1!");

	string u = "test1!";

	dict->insert(3, u);

	printf("Insert %d [%s]\n", 3, "test2!");

	string v = "test2!";

	dict->insert(3, v);

	printf("Insert %d [%s]\n", 4, "test3!");

	string w = "test3!";

	dict->insert(4, w);

	cout << "Testing equality query on key 3: " << endl;
	Cursor<int, string> *eq_cursor = dict->equality(3);

	while (eq_cursor->next()) {
		cout << "[eq] Got back [" << eq_cursor->getKey() << ", " << eq_cursor->getValue() << "]" << endl;
	}

	cout << endl;

	delete eq_cursor;

	cout << "Testing all records query: " << endl;
	Cursor<int, string> *all_cursor = dict->allRecords();

	while (all_cursor->next()) {
		cout << "[all] Got back [" << all_cursor->getKey() << ", " << all_cursor->getValue() << "]" << endl;
	}

	cout << endl;

	delete all_cursor;

	cout << "Testing range query: 2<=key<=3 " << endl;
	Cursor<int, string> *range_cursor = dict->range(2, 3);

	while (range_cursor->next()) {
		cout << "[range] Got back [" << range_cursor->getKey() << ", " << range_cursor->getValue() << "]" << endl;
	}

	cout << endl;

	delete range_cursor;

	delete dict;
}